

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::Reader::decodeNumber(Reader *this,Token *token)

{
  Location pCVar1;
  ushort uVar2;
  ValueHolder *pVVar3;
  ValueHolder VVar4;
  Value *pVVar5;
  Location pCVar6;
  ValueHolder VVar7;
  ValueHolder VVar8;
  bool bVar9;
  _Elt_pointer ppVVar10;
  undefined1 auVar11 [16];
  Value decoded;
  undefined1 auStack_68 [32];
  size_t local_48;
  ValueHolder local_40;
  ushort local_38;
  ValueHolder local_28;
  ValueHolder VStack_20;
  
  auStack_68._8_2_ = 0;
  auStack_68._16_16_ = (undefined1  [16])0x0;
  local_48 = 0;
  bVar9 = decodeNumber(this,token,(Value *)auStack_68);
  if (bVar9) {
    Value::Value((Value *)&local_40,(Value *)auStack_68);
    ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar10 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar3 = &ppVVar10[-1]->value_;
    uVar2 = *(ushort *)(pVVar3 + 1);
    VVar4 = *pVVar3;
    *pVVar3 = local_40;
    *(ushort *)(pVVar3 + 1) = local_38 & 0x1ff | uVar2 & 0xfe00;
    local_38 = uVar2 & 0x1ff | local_38 & 0xfe00;
    VVar7 = pVVar3[3];
    VVar8 = pVVar3[4];
    pVVar3[3] = local_28;
    pVVar3[4] = VStack_20;
    local_40 = VVar4;
    local_28 = VVar7;
    VStack_20 = VVar8;
    Value::~Value((Value *)&local_40);
    ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar10 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x3f;
    }
    else {
      ppVVar10 = ppVVar10 + -1;
    }
    pVVar5 = *ppVVar10;
    pCVar6 = token->end_;
    pCVar1 = this->begin_;
    auVar11._8_4_ = (int)pCVar1;
    auVar11._0_8_ = pCVar1;
    auVar11._12_4_ = (int)((ulong)pCVar1 >> 0x20);
    pVVar5->start_ = (long)token->start_ - (long)pCVar1;
    pVVar5->limit_ = (long)pCVar6 - auVar11._8_8_;
  }
  Value::~Value((Value *)auStack_68);
  return bVar9;
}

Assistant:

bool Reader::decodeNumber(Token& token) {
  Value decoded;
  if (!decodeNumber(token, decoded))
    return false;
  currentValue() = decoded;
  currentValue().setOffsetStart(token.start_ - begin_);
  currentValue().setOffsetLimit(token.end_ - begin_);
  return true;
}